

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O0

float __thiscall
deqp::gles3::Functional::VertexCubeTextureCase::calculateLod
          (VertexCubeTextureCase *this,Vec2 *texScale,Vec2 *dstSize,int textureNdx)

{
  int iVar1;
  int iVar2;
  TextureCube *this_00;
  float fVar3;
  float y;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vec2 sizeRatio;
  Vec2 srcSize;
  TextureCube *refTexture;
  int textureNdx_local;
  Vec2 *dstSize_local;
  Vec2 *texScale_local;
  VertexCubeTextureCase *this_local;
  
  this_00 = glu::TextureCube::getRefTexture(this->m_textures[textureNdx]);
  iVar1 = tcu::TextureCube::getSize(this_00);
  iVar2 = tcu::TextureCube::getSize(this_00);
  tcu::Vector<float,_2>::Vector(&sizeRatio,(float)iVar1,(float)iVar2);
  tcu::operator*((tcu *)&local_48,texScale,&sizeRatio);
  tcu::operator/((tcu *)&local_40,&local_48,dstSize);
  fVar3 = tcu::Vector<float,_2>::x(&local_40);
  y = tcu::Vector<float,_2>::y(&local_40);
  fVar3 = de::max<float>(fVar3,y);
  fVar3 = deFloatLog2(fVar3);
  return fVar3;
}

Assistant:

float VertexCubeTextureCase::calculateLod (const Vec2& texScale, const Vec2& dstSize, int textureNdx) const
{
	const tcu::TextureCube&		refTexture	= m_textures[textureNdx]->getRefTexture();
	const Vec2					srcSize		= Vec2((float)refTexture.getSize(), (float)refTexture.getSize());
	const Vec2					sizeRatio	= texScale*srcSize / dstSize;

	// \note In this particular case, dv/dx and du/dy are zero, simplifying the expression.
	return deFloatLog2(de::max(sizeRatio.x(), sizeRatio.y()));
}